

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O0

string * cfd::core::DescriptorKeyInfo::GetExtPrivkeyInformation
                   (string *__return_storage_ptr__,ExtPrivkey *ext_privkey,string *child_path)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  string *__lhs;
  string local_b8 [32];
  long local_98;
  size_type index;
  string local_78;
  string local_58 [55];
  undefined1 local_21;
  string *local_20;
  string *child_path_local;
  ExtPrivkey *ext_privkey_local;
  string *result;
  
  local_21 = 0;
  __lhs = __return_storage_ptr__;
  local_20 = child_path;
  child_path_local = (string *)ext_privkey;
  ext_privkey_local = (ExtPrivkey *)__return_storage_ptr__;
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  bVar1 = ExtPrivkey::IsValid((ExtPrivkey *)child_path_local);
  if (bVar1) {
    ExtPrivkey::GetFingerprintData((ByteData *)&index,(ExtPrivkey *)child_path_local);
    ByteData::GetHex_abi_cxx11_(&local_78,(ByteData *)&index);
    ::std::operator+((char *)__lhs,__return_storage_ptr__);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_58);
    ::std::__cxx11::string::~string(local_58);
    ::std::__cxx11::string::~string((string *)&local_78);
    ByteData::~ByteData((ByteData *)0x40a0d9);
    uVar2 = ::std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      local_98 = 0;
      pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)local_20);
      if ((*pcVar3 == 'm') ||
         (pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)local_20), *pcVar3 == 'M')) {
        local_98 = local_98 + 1;
      }
      pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)local_20);
      if (*pcVar3 != '/') {
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/");
      }
      ::std::__cxx11::string::substr((ulong)local_b8,(ulong)local_20);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_b8);
      ::std::__cxx11::string::~string(local_b8);
    }
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"]");
  }
  return __lhs;
}

Assistant:

std::string DescriptorKeyInfo::GetExtPrivkeyInformation(
    const ExtPrivkey& ext_privkey, const std::string& child_path) {
  std::string result;
  if (ext_privkey.IsValid()) {
    result = "[" + ext_privkey.GetFingerprintData().GetHex();
    if (!child_path.empty()) {
      std::string::size_type index = 0;
      if ((child_path[0] == 'm') || (child_path[0] == 'M')) ++index;
      if (child_path[index] != '/') {
        result += "/";
      }
      result += child_path.substr(index);
    }
    result += "]";
  }
  return result;
}